

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O1

void jpc_qmfb_split_colgrp(jpc_fix_t *a,uint numrows,uint stride,uint parity)

{
  undefined1 *ptr;
  jpc_fix_t *pjVar1;
  jpc_fix_t *pjVar2;
  uint n;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  long lVar6;
  uint uVar7;
  jpc_fix_t splitbuf [65536];
  undefined1 auStack_80028 [524288];
  
  ptr = auStack_80028;
  uVar7 = numrows + 1;
  if ((0x2001 < uVar7) &&
     (ptr = (undefined1 *)jas_alloc3((ulong)(uVar7 >> 1),0x10,8), ptr == (undefined1 *)0x0)) {
    abort();
  }
  if (1 < numrows) {
    uVar7 = uVar7 - parity >> 1;
    pjVar1 = a + (1 - parity) * stride;
    iVar3 = numrows - uVar7;
    if (iVar3 != 0) {
      pjVar2 = pjVar1;
      puVar5 = ptr;
      iVar4 = iVar3;
      do {
        lVar6 = 0;
        do {
          *(jpc_fix_t *)(puVar5 + lVar6 * 8) = pjVar2[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 0x10);
        puVar5 = puVar5 + 0x80;
        pjVar2 = pjVar2 + stride * 2;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    iVar4 = uVar7 - (parity == 0);
    if (iVar4 != 0) {
      pjVar2 = a + (2 - parity) * stride;
      do {
        lVar6 = 0;
        do {
          pjVar1[lVar6] = pjVar2[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 0x10);
        pjVar1 = pjVar1 + stride;
        pjVar2 = pjVar2 + stride * 2;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    if (iVar3 != 0) {
      pjVar1 = a + uVar7 * stride;
      puVar5 = ptr;
      do {
        lVar6 = 0;
        do {
          pjVar1[lVar6] = *(jpc_fix_t *)(puVar5 + lVar6 * 8);
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 0x10);
        puVar5 = puVar5 + 0x80;
        pjVar1 = pjVar1 + stride;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  if (ptr != auStack_80028) {
    jas_free(ptr);
  }
  return;
}

Assistant:

static void jpc_qmfb_split_colgrp(jpc_fix_t *a, unsigned numrows, unsigned stride,
  unsigned parity)
{

	jpc_fix_t splitbuf[QMFB_SPLITBUFSIZE * JPC_QMFB_COLGRPSIZE];
	jpc_fix_t *buf = splitbuf;
	jpc_fix_t *srcptr;
	jpc_fix_t *dstptr;
	register jpc_fix_t *srcptr2;
	register jpc_fix_t *dstptr2;

	/* Get a buffer. */
	const size_t bufsize = JPC_CEILDIVPOW2(numrows, 1);
	if (bufsize > QMFB_SPLITBUFSIZE) {
		if (!(buf = jas_alloc3(bufsize, JPC_QMFB_COLGRPSIZE,
		  sizeof(jpc_fix_t)))) {
			/* We have no choice but to commit suicide in this case. */
			abort();
		}
	}

	if (numrows >= 2) {
		const unsigned hstartrow = (numrows + 1 - parity) >> 1;
		// ORIGINAL (WRONG): m = (parity) ? hstartrow : (numrows - hstartrow);
		const unsigned m = numrows - hstartrow;

		/* Save the samples destined for the highpass channel. */
		dstptr = buf;
		srcptr = &a[(1 - parity) * stride];
		for (unsigned n = m; n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += JPC_QMFB_COLGRPSIZE;
			srcptr += stride << 1;
		}
		/* Copy the appropriate samples into the lowpass channel. */
		dstptr = &a[(1 - parity) * stride];
		srcptr = &a[(2 - parity) * stride];
		for (unsigned n = numrows - m - (!parity); n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += stride;
			srcptr += stride << 1;
		}
		/* Copy the saved samples into the highpass channel. */
		dstptr = &a[hstartrow * stride];
		srcptr = buf;
		for (unsigned n = m; n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += stride;
			srcptr += JPC_QMFB_COLGRPSIZE;
		}
	}

	/* If the split buffer was allocated on the heap, free this memory. */
	if (buf != splitbuf) {
		jas_free(buf);
	}

}